

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::returnFromRun(Highs *this,HighsStatus run_return_status,bool undo_mods)

{
  HighsSolution *solution;
  HighsBasis *basis;
  HighsModel *lp;
  string *__lhs;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  HighsStatus HVar5;
  HighsDebugStatus HVar6;
  int iVar7;
  HighsStatus return_status;
  string local_70;
  string local_50;
  
  HVar5 = highsStatusFromHighsModelStatus(this->model_status_);
  return_status = HVar5;
  if (HVar5 != run_return_status) {
    utilModelStatusToString_abi_cxx11_(&local_50,this->model_status_);
    printf("Highs::returnFromRun: return_status = %d != %d = run_return_status For model_status_ = %s\n"
           ,(ulong)(uint)HVar5,(ulong)(uint)run_return_status,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
  }
  switch(this->model_status_) {
  case kMin:
  case kLoadError:
  case kModelError:
  case kPresolveError:
  case kSolveError:
  case kPostsolveError:
  case kModelEmpty:
  case kMax:
    HighsInfo::invalidate(&this->info_);
    invalidateSolution(this);
    invalidateBasis(this);
    break;
  case kUnboundedOrInfeasible:
    if ((this->options_).super_HighsOptionsStruct.allow_unbounded_or_infeasible == false) {
      __lhs = &(this->options_).super_HighsOptionsStruct.solver;
      _Var4 = std::operator==(__lhs,&::kIpmString_abi_cxx11_);
      if ((((!_Var4) ||
           (_Var4 = std::operator==(&(this->options_).super_HighsOptionsStruct.run_crossover,
                                    &::kHighsOnString_abi_cxx11_), !_Var4)) &&
          (_Var4 = std::operator==(__lhs,&::kPdlpString_abi_cxx11_), !_Var4)) &&
         (bVar3 = HighsLp::isMip(&(this->model_).lp_), !bVar3)) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                     "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not permitted\n")
        ;
        return_status = kError;
      }
    }
  }
  solution = &this->solution_;
  bVar3 = (this->solution_).value_valid;
  bVar1 = (this->solution_).dual_valid;
  bVar2 = (this->basis_).valid;
  if ((bVar3 == true) &&
     (HVar6 = debugPrimalSolutionRightSize(&this->options_,&(this->model_).lp_,solution),
     HVar6 == kLogicalError)) {
    return_status = kError;
  }
  if ((bVar1 != false) &&
     (HVar6 = debugDualSolutionRightSize(&this->options_,&(this->model_).lp_,solution),
     HVar6 == kLogicalError)) {
    return_status = kError;
  }
  basis = &this->basis_;
  if ((bVar2 != false) &&
     (HVar6 = debugBasisRightSize(&this->options_,&(this->model_).lp_,basis), HVar6 == kLogicalError
     )) {
    return_status = kError;
  }
  if (bVar3 != false) {
    std::__cxx11::string::string((string *)&local_70,"Return from run()",(allocator *)&local_50);
    HVar6 = debugHighsSolution(&local_70,&this->options_,&this->model_,solution,basis,
                               this->model_status_,&this->info_);
    std::__cxx11::string::~string((string *)&local_70);
    if (HVar6 == kLogicalError) {
      return_status = kError;
    }
  }
  lp = &this->model_;
  HVar6 = debugInfo(&this->options_,&lp->lp_,basis,solution,&this->info_,this->model_status_);
  if (HVar6 == kLogicalError) {
    return_status = kError;
  }
  this->called_return_from_run = true;
  if (undo_mods) {
    restoreInfCost(this,&return_status);
    HighsLp::unapplyMods(&lp->lp_);
  }
  iVar7 = std::__cxx11::string::compare((string *)&(this->options_).super_HighsOptionsStruct.solver)
  ;
  if (((iVar7 != 0) || (bVar3 = HighsLp::isMip(&lp->lp_), !bVar3)) ||
     (((this->options_).super_HighsOptionsStruct.solve_relaxation & 1U) != 0)) {
    reportSolvedLpQpStats(this);
  }
  HVar5 = returnFromHighs(this,return_status);
  return HVar5;
}

Assistant:

HighsStatus Highs::returnFromRun(const HighsStatus run_return_status,
                                 const bool undo_mods) {
  assert(!called_return_from_run);
  HighsStatus return_status = highsStatusFromHighsModelStatus(model_status_);
  if (return_status != run_return_status) {
    printf(
        "Highs::returnFromRun: return_status = %d != %d = run_return_status "
        "For model_status_ = %s\n",
        int(return_status), int(run_return_status),
        modelStatusToString(model_status_).c_str());
  }
  assert(return_status == run_return_status);
  //  return_status = run_return_status;
  switch (model_status_) {
      // First consider the error returns
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kMemoryLimit:
      // Don't clear the model status!
      //      invalidateSolverData();
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kError);
      break;

      // Then consider the OK returns
    case HighsModelStatus::kModelEmpty:
      invalidateInfo();
      invalidateSolution();
      invalidateBasis();
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kOptimal:
      // The following is an aspiration
      //
      // assert(info_.primal_solution_status == kSolutionStatusFeasible);
      //
      // assert(info_.dual_solution_status == kSolutionStatusFeasible);
      assert(model_status_ == HighsModelStatus::kNotset ||
             model_status_ == HighsModelStatus::kOptimal);
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
      // For kInfeasible, will not have a basis, if infeasibility was
      // detected in presolve or by IPX without crossover
      assert(return_status == HighsStatus::kOk);
      break;

    case HighsModelStatus::kUnboundedOrInfeasible:
      if (options_.allow_unbounded_or_infeasible ||
          (options_.solver == kIpmString &&
           options_.run_crossover == kHighsOnString) ||
          (options_.solver == kPdlpString) || model_.isMip()) {
        assert(return_status == HighsStatus::kOk);
      } else {
        // This model status is not permitted unless IPM is run without
        // crossover, or if PDLP is used
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "returnFromHighs: HighsModelStatus::kUnboundedOrInfeasible is not "
            "permitted\n");
        assert(options_.allow_unbounded_or_infeasible);
        return_status = HighsStatus::kError;
      }
      break;

      // Finally consider the warning returns
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      assert(return_status == HighsStatus::kWarning);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  // Now to check what's available with each model status
  //
  const bool have_info = info_.valid;
  const bool have_primal_solution = solution_.value_valid;
  const bool have_dual_solution = solution_.dual_valid;
  // Can't have a dual solution without a primal solution
  assert(have_primal_solution || !have_dual_solution);
  //  const bool have_solution = have_primal_solution && have_dual_solution;
  const bool have_basis = basis_.valid;
  switch (model_status_) {
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kModelEmpty:
    case HighsModelStatus::kMemoryLimit:
      // No info, primal solution or basis
      assert(have_info == false);
      assert(have_primal_solution == false);
      assert(have_basis == false);
      break;
    case HighsModelStatus::kOptimal:
    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
    case HighsModelStatus::kUnboundedOrInfeasible:
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kInterrupt:
    case HighsModelStatus::kUnknown:
      // Have info and primal solution (unless infeasible). No primal solution
      // in some other case, too!
      assert(have_info == true);
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }
  if (have_primal_solution) {
    if (debugPrimalSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_dual_solution) {
    if (debugDualSolutionRightSize(options_, model_.lp_, solution_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_basis) {
    if (debugBasisRightSize(options_, model_.lp_, basis_) ==
        HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (have_primal_solution) {
    // Debug the Highs solution - needs primal values at least
    if (debugHighsSolution("Return from run()", options_, model_, solution_,
                           basis_, model_status_,
                           info_) == HighsDebugStatus::kLogicalError)
      return_status = HighsStatus::kError;
  }
  if (debugInfo(options_, model_.lp_, basis_, solution_, info_,
                model_status_) == HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;

  // Record that returnFromRun() has been called
  called_return_from_run = true;

  if (undo_mods) {
    // Restore any infinite costs
    this->restoreInfCost(return_status);

    // Unapply any modifications that have not yet been unapplied
    this->model_.lp_.unapplyMods();
    //    undo_mods = false;
  }

  // Unless solved as a MIP, report on the solution
  const bool solved_as_mip = !options_.solver.compare(kHighsChooseString) &&
                             model_.isMip() && !options_.solve_relaxation;
  if (!solved_as_mip) reportSolvedLpQpStats();
  return returnFromHighs(return_status);
}